

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall embree::Texture::Texture(Texture *this,Ref<embree::Image> *img,string *fileName)

{
  uint x;
  uint x_00;
  bool bVar1;
  uchar *dest;
  uint uVar2;
  
  this->width = (uint)img->ptr->width;
  this->height = (uint)img->ptr->height;
  this->format = RGBA8;
  this->bytesPerTexel = 4;
  this->width_mask = 0;
  this->height_mask = 0;
  this->data = (void *)0x0;
  std::__cxx11::string::string((string *)&this->fileName,(string *)fileName);
  x = this->width;
  bVar1 = isPowerOf2(x);
  uVar2 = x - 1;
  if (!bVar1) {
    uVar2 = 0;
  }
  this->width_mask = uVar2;
  x_00 = this->height;
  bVar1 = isPowerOf2(x_00);
  uVar2 = x_00 - 1;
  if (!bVar1) {
    uVar2 = 0;
  }
  this->height_mask = uVar2;
  dest = (uchar *)alignedUSMMalloc((ulong)(x * x_00 * 4),0x10,DEVICE_READ_ONLY);
  this->data = dest;
  Image::convertToRGBA8(img->ptr,dest);
  return;
}

Assistant:

Texture::Texture(Ref<Image> img, const std::string fileName)
    : width(unsigned(img->width)), height(unsigned(img->height)), format(RGBA8), bytesPerTexel(4), width_mask(0), height_mask(0), data(nullptr), fileName(fileName)
  {
    width_mask  = isPowerOf2(width) ? width-1 : 0;
    height_mask = isPowerOf2(height) ? height-1 : 0;

    data = alignedUSMMalloc(4*width*height,16);
    img->convertToRGBA8((unsigned char*)data);
  }